

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O1

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenOperator(Lexer *this)

{
  TokenType type;
  undefined8 *puVar1;
  size_t __n;
  bool bVar2;
  size_t __s2;
  size_t sVar3;
  _Head_base<0UL,_pfederc::Token_*,_false> _Var4;
  int iVar5;
  Token *this_00;
  undefined8 *puVar6;
  Lexer *in_RSI;
  string op;
  Position local_78;
  _Head_base<0UL,_pfederc::Token_*,_false> local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  type = TOK_ERR;
  local_58._M_head_impl = (Token *)this;
  do {
    local_78.line = (size_t)&local_78.endIndex;
    std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_50,local_50 + local_48);
    std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_78.startIndex,0,'\x01');
    sVar3 = local_78.startIndex;
    __s2 = local_78.line;
    if (local_78.startIndex - 4 < 0xfffffffffffffffd) {
LAB_00107ae9:
      bVar2 = false;
    }
    else {
      puVar6 = *(undefined8 **)(KEYWORDS_abi_cxx11_ + local_78.startIndex * 0x18 + 0x98);
      puVar1 = *(undefined8 **)(KEYWORDS_abi_cxx11_ + local_78.startIndex * 0x18 + 0xa0);
      if (puVar6 == puVar1) goto LAB_00107ae9;
      do {
        __n = puVar6[1];
        if ((__n == sVar3) &&
           ((__n == 0 || (iVar5 = bcmp((void *)*puVar6,(void *)__s2,__n), iVar5 == 0)))) {
          type = *(TokenType *)(puVar6 + 4);
          bVar2 = true;
          goto LAB_00107b01;
        }
        puVar6 = puVar6 + 5;
      } while (puVar6 != puVar1);
      bVar2 = false;
    }
LAB_00107b01:
    if ((size_t *)local_78.line != &local_78.endIndex) {
      operator_delete((void *)local_78.line,local_78.endIndex + 1);
    }
    _Var4._M_head_impl = local_58._M_head_impl;
    if (!bVar2) break;
    std::__cxx11::string::push_back((char)&local_50);
    nextChar(in_RSI);
  } while( true );
  if (local_48 == 0) {
    (local_58._M_head_impl)->_vptr_Token = (_func_int **)0x0;
    goto LAB_00107bc0;
  }
  if (type == TOK_OP_DIV) {
    if (in_RSI->currentChar == 0x2f) {
      nextLineComment((Lexer *)local_58._M_head_impl);
      goto LAB_00107bc0;
    }
    if (in_RSI->currentChar == 0x2a) {
      nextRegionComment((Lexer *)local_58._M_head_impl);
      goto LAB_00107bc0;
    }
  }
  getCurrentCursor(&local_78,in_RSI);
  this_00 = (Token *)operator_new(0x30);
  Token::Token(this_00,in_RSI->currentToken,type,&local_78);
  (_Var4._M_head_impl)->_vptr_Token = (_func_int **)this_00;
LAB_00107bc0:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         _Var4._M_head_impl;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenOperator() noexcept {
  std::string op;
  TokenType operatorType = TokenType::TOK_ERR;
  while (_hasOperatorStr(op + (char) currentChar, operatorType)) {
    op += (char) currentChar;
    nextChar();
  }
  // no match
  if (op.empty())
    return nullptr;

  // if match check if comment (starting with '/')
  if (operatorType == TokenType::TOK_OP_DIV) {
    if (currentChar == '*') // region comment
      return nextRegionComment();
    else if (currentChar == '/') // one line comment
      return nextLineComment();
  }

  return std::make_unique<Token>(currentToken, operatorType, getCurrentCursor());
}